

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

statusline checkprotoprefix(Curl_easy *data,connectdata *conn,char *s,size_t len)

{
  size_t len_local;
  char *s_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((conn->handler->protocol & 0x40000) == 0) {
    data_local._4_4_ = checkhttpprefix(data,s,len);
  }
  else {
    data_local._4_4_ = checkrtspprefix(data,s,len);
  }
  return data_local._4_4_;
}

Assistant:

static statusline
checkprotoprefix(struct Curl_easy *data, struct connectdata *conn,
                 const char *s, size_t len)
{
#ifndef CURL_DISABLE_RTSP
  if(conn->handler->protocol & CURLPROTO_RTSP)
    return checkrtspprefix(data, s, len);
#else
  (void)conn;
#endif /* CURL_DISABLE_RTSP */

  return checkhttpprefix(data, s, len);
}